

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float16 float16_mul_mips(float16 a,float16 b,float_status *status)

{
  float16 fVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint64_t uVar7;
  bool bVar8;
  FloatParts FVar9;
  FloatParts b_00;
  uint64_t hi;
  ulong local_40;
  uint64_t local_38;
  ulong a_00;
  
  FVar9 = float16a_unpack_canonical(a,status,&float16_params);
  uVar6 = FVar9._8_8_;
  a_00 = FVar9.frac;
  b_00 = float16a_unpack_canonical(b,status,&float16_params);
  uVar2 = b_00._8_8_;
  uVar4 = (uVar2 ^ uVar6) & 0x10000000000;
  uVar3 = FVar9._12_4_ & 0xff;
  uVar5 = b_00._12_4_ & 0xff;
  if ((uVar3 == 2) && (uVar5 == 2)) {
    mul64To128(a_00,b_00.frac,&local_38,&local_40);
    uVar2 = local_38 << 2 | local_40 >> 0x3e;
    bVar8 = (local_40 & 0x3fffffffffffffff) != 0;
    a_00 = (ulong)((uint)bVar8 | (uint)uVar2 & 1) | uVar2 >> 1;
    if (-1 < (long)uVar2) {
      a_00 = bVar8 | uVar2;
    }
    uVar6 = uVar6 & 0xffff00ff00000000 |
            (ulong)(uint)((b_00.exp + FVar9.exp) - (int)((long)(local_38 << 2) >> 0x3f));
  }
  else {
    if (((uVar6 | uVar2) & 0xfc00000000) != 0) {
      FVar9 = pick_nan(FVar9,b_00,status);
      goto LAB_0069257c;
    }
    if (((uVar3 == 3) && (uVar5 == 1)) || ((uVar3 == 1 && (uVar5 == 3)))) {
      status->float_exception_flags = status->float_exception_flags | 1;
      uVar7 = 0x2000000000000000;
      if (status->snan_bit_is_one != '\0') {
        uVar7 = 0x1fffffffffffffff;
      }
      FVar9.exp = 0x7fffffff;
      FVar9.cls = float_class_qnan;
      FVar9.sign = false;
      FVar9._14_2_ = 0;
      FVar9.frac = uVar7;
      goto LAB_0069257c;
    }
    if ((uVar3 | 2) != 3) {
      if ((uVar5 | 2) != 3) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                   ,0x4e6,(char *)0x0);
      }
      uVar4 = uVar4 | uVar2 & 0xffff0003ffffffff;
      FVar9.exp = (int)uVar4;
      FVar9.cls = (char)(uVar4 >> 0x20);
      FVar9.sign = (_Bool)(char)(uVar4 >> 0x28);
      FVar9._14_2_ = (short)(uVar4 >> 0x30);
      FVar9.frac = b_00.frac;
      goto LAB_0069257c;
    }
    uVar6 = uVar6 & 0xffff0003ffffffff;
  }
  uVar6 = uVar6 | uVar4;
  FVar9.exp = (int)uVar6;
  FVar9.cls = (char)(uVar6 >> 0x20);
  FVar9.sign = (_Bool)(char)(uVar6 >> 0x28);
  FVar9._14_2_ = (short)(uVar6 >> 0x30);
  FVar9.frac = a_00;
LAB_0069257c:
  fVar1 = float16a_round_pack_canonical(FVar9,status,&float16_params);
  return fVar1;
}

Assistant:

float16 QEMU_FLATTEN float16_mul(float16 a, float16 b, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pr = mul_floats(pa, pb, status);

    return float16_round_pack_canonical(pr, status);
}